

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O2

ssize_t __thiscall
QHeaderViewPrivate::read(QHeaderViewPrivate *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  QHeaderView *this_00;
  QAbstractItemModel *pQVar2;
  HeaderMode HVar3;
  pointer pSVar4;
  QModelIndex *__return_storage_ptr__;
  ulong uVar5;
  undefined4 in_register_00000034;
  QDataStream *this_01;
  long lVar6;
  int iVar7;
  int i;
  int t;
  ulong i_00;
  int u;
  ulong uVar8;
  long in_FS_OFFSET;
  bool bVar9;
  QModelIndex local_160;
  QModelIndex local_148;
  int iHeaderMode;
  int inSortIndicatorClearable;
  int inLastSectionSize;
  bool tmpbool;
  int tmpint;
  QArrayDataPointer<QHeaderViewPrivate::SectionItem> local_118;
  int unusedSectionCount;
  QArrayDataPointer<char> local_f8;
  QArrayDataPointer<QHeaderViewPrivate::SectionItem> local_d8;
  int minimumSectionSizeIn;
  int defaultSectionSizeIn;
  int contentsSectionsIn;
  int stretchSectionsIn;
  bool cascadingResizingIn;
  bool stretchLastSectionIn;
  bool highlightSelectedIn;
  bool clickableSectionsIn;
  bool movableSectionsIn;
  QHash<int,_int> local_a0;
  QArrayDataPointer<int> local_98;
  QArrayDataPointer<int> local_78;
  int lengthIn;
  bool sortIndicatorShownIn;
  int sortIndicatorSectionIn;
  int global;
  int align;
  int order;
  int orient;
  long local_38;
  
  this_01 = (QDataStream *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QHeaderView **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  orient = -0x55555556;
  order = -0x55555556;
  align = -0x55555556;
  global = -0x55555556;
  sortIndicatorSectionIn = -0x55555556;
  sortIndicatorShownIn = true;
  lengthIn = -0x55555556;
  local_78.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (int *)0x0;
  local_98.d = (Data *)0x0;
  local_98.ptr = (int *)0x0;
  local_98.size = 0;
  local_a0.d = (Data *)0x0;
  movableSectionsIn = true;
  clickableSectionsIn = true;
  highlightSelectedIn = true;
  stretchLastSectionIn = true;
  cascadingResizingIn = true;
  stretchSectionsIn = -0x55555556;
  contentsSectionsIn = -0x55555556;
  defaultSectionSizeIn = -0x55555556;
  minimumSectionSizeIn = -0x55555556;
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (SectionItem *)0x0;
  local_d8.size = 0;
  QDataStream::operator>>(this_01,&orient);
  QDataStream::operator>>(this_01,&order);
  QDataStream::operator>>(this_01,&sortIndicatorSectionIn);
  QDataStream::operator>>(this_01,&sortIndicatorShownIn);
  QtPrivate::readArrayBasedContainer<QList<int>>(this_01,(QList<int> *)&local_78);
  QtPrivate::readArrayBasedContainer<QList<int>>(this_01,(QList<int> *)&local_98);
  local_f8.d = (Data *)0x0;
  local_f8.ptr = (char *)0x0;
  local_f8.size = 0;
  ::operator>>(this_01,(QBitArray *)&local_f8);
  QtPrivate::readAssociativeContainer<QHash<int,int>>(this_01,&local_a0);
  QDataStream::operator>>(this_01,&lengthIn);
  unusedSectionCount = -0x55555556;
  QDataStream::operator>>(this_01,&unusedSectionCount);
  uVar8 = 0;
  if ((this_01[0x13] != (QDataStream)0x0) || (lengthIn < 0)) goto LAB_004f95e8;
  QDataStream::operator>>(this_01,&movableSectionsIn);
  QDataStream::operator>>(this_01,&clickableSectionsIn);
  QDataStream::operator>>(this_01,&highlightSelectedIn);
  QDataStream::operator>>(this_01,&stretchLastSectionIn);
  QDataStream::operator>>(this_01,&cascadingResizingIn);
  QDataStream::operator>>(this_01,&stretchSectionsIn);
  QDataStream::operator>>(this_01,&contentsSectionsIn);
  QDataStream::operator>>(this_01,&defaultSectionSizeIn);
  QDataStream::operator>>(this_01,&minimumSectionSizeIn);
  QDataStream::operator>>(this_01,&align);
  QDataStream::operator>>(this_01,&global);
  uVar5 = 0;
  uVar8 = uVar5;
  if ((3 < (uint)global) || (uVar8 = 0, 0x1e0 < (uint)align)) goto LAB_004f95e8;
  QtPrivate::readArrayBasedContainer<QList<QHeaderViewPrivate::SectionItem>>
            (this_01,(QList<QHeaderViewPrivate::SectionItem> *)&local_d8);
  local_118.size = 0;
  local_118.d = (Data *)0x0;
  local_118.ptr = (SectionItem *)0x0;
  for (uVar8 = 0; uVar8 < (ulong)local_d8.size; uVar8 = uVar8 + 1) {
    uVar1 = local_d8.ptr[uVar8].field_4.calculated_startpos;
    if (1 < (int)uVar1) {
      pSVar4 = QList<QHeaderViewPrivate::SectionItem>::data
                         ((QList<QHeaderViewPrivate::SectionItem> *)&local_d8);
      *(uint *)(pSVar4 + uVar8) =
           *(uint *)(pSVar4 + uVar8) & 0xfff00000 | (*(uint *)(pSVar4 + uVar8) & 0xfffff) / uVar1;
    }
    uVar5 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar5 = 0;
    }
    while (iVar7 = (int)uVar5, uVar5 = (ulong)(iVar7 - 1), iVar7 != 0) {
      pSVar4 = QList<QHeaderViewPrivate::SectionItem>::data
                         ((QList<QHeaderViewPrivate::SectionItem> *)&local_d8);
      QList<QHeaderViewPrivate::SectionItem>::emplaceBack<QHeaderViewPrivate::SectionItem_const&>
                ((QList<QHeaderViewPrivate::SectionItem> *)&local_118,pSVar4 + uVar8);
    }
  }
  iVar7 = 0;
  for (lVar6 = 0; local_118.size * 8 - lVar6 != 0; lVar6 = lVar6 + 8) {
    iVar7 = iVar7 + (*(uint *)(&(local_118.ptr)->field_0x0 + lVar6) & 0xfffff);
  }
  if ((iVar7 == lengthIn) || (local_118.size == 0)) {
    this->headerMode = FlexibleWithSectionMemoryUsage;
    this->orientation = orient;
    this->sortIndicatorOrder = order;
    this->sortIndicatorSection = sortIndicatorSectionIn;
    this->sortIndicatorShown = sortIndicatorShownIn;
    QArrayDataPointer<int>::operator=(&(this->visualIndices).d,&local_78);
    QArrayDataPointer<int>::operator=(&(this->logicalIndices).d,&local_98);
    QHash<int,_int>::operator=(&this->hiddenSectionSize,&local_a0);
    this->length = lengthIn;
    this->movableSections = movableSectionsIn;
    this->clickableSections = clickableSectionsIn;
    this->highlightSelected = highlightSelectedIn;
    this->stretchLastSection = stretchLastSectionIn;
    this->cascadingResizing = cascadingResizingIn;
    this->stretchSections = stretchSectionsIn;
    this->contentsSections = contentsSectionsIn;
    this->defaultSectionSize = defaultSectionSizeIn;
    this->minimumSectionSize = minimumSectionSizeIn;
    (this->defaultAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i = align;
    this->globalResizeMode = global;
    QArrayDataPointer<QHeaderViewPrivate::SectionItem>::operator=
              (&(this->sectionItems).d,&local_118);
    setHiddenSectionsFromBitVector(this,(QBitArray *)&local_f8);
    recalcSectionStartPos(this);
    tmpint = -0x55555556;
    QDataStream::operator>>(this_01,&tmpint);
    if (this_01[0x13] == (QDataStream)0x0) {
      this->resizeContentsPrecision = tmpint;
    }
    tmpbool = true;
    QDataStream::operator>>(this_01,&tmpbool);
    if ((this_01[0x13] == (QDataStream)0x0) &&
       (this->customDefaultSectionSize = tmpbool, tmpbool == false)) {
      updateDefaultSectionSizeFromStyle(this);
    }
    this->lastSectionSize = -1;
    inLastSectionSize = -0x55555556;
    QDataStream::operator>>(this_01,&inLastSectionSize);
    if (this_01[0x13] == (QDataStream)0x0) {
      this->lastSectionSize = inLastSectionSize;
    }
    this->lastSectionLogicalIdx = -1;
    if (this->stretchLastSection == true) {
      iVar7 = lastVisibleVisualIndex(this);
      iVar7 = QHeaderView::logicalIndex(this_00,iVar7);
      this->lastSectionLogicalIdx = iVar7;
      doDelayedResizeSections(this);
    }
    inSortIndicatorClearable = -0x55555556;
    QDataStream::operator>>(this_01,&inSortIndicatorClearable);
    if (this_01[0x13] == (QDataStream)0x0) {
      this->sortIndicatorClearable = inSortIndicatorClearable != 0;
    }
    QDataStream::operator>>(this_01,&this->countInNoSectionItemsMode);
    iHeaderMode = -0x55555556;
    QDataStream::operator>>(this_01,&iHeaderMode);
    if (this_01[0x13] == (QDataStream)0x0) {
      HVar3 = iHeaderMode;
      if (1 < (uint)iHeaderMode) {
        lVar6 = (this->sectionItems).d.size;
        if (this->countInNoSectionItemsMode < 1) {
          if (lVar6 != 0) goto LAB_004f948c;
        }
        else if (lVar6 == 0) {
          HVar3 = InitialNoSectionMemoryUsage;
          goto LAB_004f949e;
        }
        this->headerMode = FlexibleWithSectionMemoryUsage;
        goto LAB_004f9238;
      }
    }
    else {
      iHeaderMode = 1;
LAB_004f948c:
      HVar3 = FlexibleWithSectionMemoryUsage;
    }
LAB_004f949e:
    this->headerMode = HVar3;
    bVar9 = orient == 1;
    __return_storage_ptr__ = &local_160;
    if (bVar9) {
      __return_storage_ptr__ = &local_148;
    }
    pQVar2 = (this->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex
              (__return_storage_ptr__,&(this->super_QAbstractItemViewPrivate).root);
    iVar7 = (**(code **)(*(long *)pQVar2 + 0x78 + (ulong)bVar9 * 8))(pQVar2,__return_storage_ptr__);
    i_00 = (this->sectionItems).d.size;
    uVar8 = CONCAT71((int7)(uVar5 >> 8),1);
    if ((long)i_00 < (long)iVar7) {
      if (this->headerMode == InitialNoSectionMemoryUsage) {
        this->countInNoSectionItemsMode = (long)iVar7;
        this->length = this->defaultSectionSize * iVar7;
      }
      else {
        if ((local_78.size != 0) && (local_98.size != 0)) {
          while (t = (int)i_00, t < iVar7) {
            QList<int>::append(&this->visualIndices,t);
            QList<int>::append(&this->logicalIndices,t);
            i_00 = (ulong)(t + 1);
          }
          i_00 = (this->sectionItems).d.size;
        }
        iVar7 = iVar7 - (int)i_00;
        lengthIn = lengthIn + defaultSectionSizeIn * iVar7;
        local_148.r = (defaultSectionSizeIn & 0xfffffU) + (this->globalResizeMode & 0x1f) * 0x200000
                      + -0x58000000;
        local_148.c = -1;
        QList<QHeaderViewPrivate::SectionItem>::insert
                  (&this->sectionItems,i_00,(long)iVar7,(parameter_type)&local_148);
      }
    }
  }
  else {
LAB_004f9238:
    uVar8 = 0;
  }
  QArrayDataPointer<QHeaderViewPrivate::SectionItem>::~QArrayDataPointer(&local_118);
LAB_004f95e8:
  QArrayDataPointer<char>::~QArrayDataPointer(&local_f8);
  QArrayDataPointer<QHeaderViewPrivate::SectionItem>::~QArrayDataPointer(&local_d8);
  QHash<int,_int>::~QHash(&local_a0);
  QArrayDataPointer<int>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<int>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool QHeaderViewPrivate::read(QDataStream &in)
{
    Q_Q(QHeaderView);
    int orient, order, align, global;
    int sortIndicatorSectionIn;
    bool sortIndicatorShownIn;
    int lengthIn;
    QList<int> visualIndicesIn;
    QList<int> logicalIndicesIn;
    QHash<int, int> hiddenSectionSizeIn;
    bool movableSectionsIn;
    bool clickableSectionsIn;
    bool highlightSelectedIn;
    bool stretchLastSectionIn;
    bool cascadingResizingIn;
    int stretchSectionsIn;
    int contentsSectionsIn;
    int defaultSectionSizeIn;
    int minimumSectionSizeIn;
    QList<SectionItem> sectionItemsIn;

    in >> orient;
    in >> order;

    in >> sortIndicatorSectionIn;
    in >> sortIndicatorShownIn;

    in >> visualIndicesIn;
    in >> logicalIndicesIn;

    QBitArray sectionHidden;
    in >> sectionHidden;
    in >> hiddenSectionSizeIn;
    in >> lengthIn;

    int unusedSectionCount; // For compatibility
    in >> unusedSectionCount;

    if (in.status() != QDataStream::Ok || lengthIn < 0)
        return false;

    in >> movableSectionsIn;
    in >> clickableSectionsIn;
    in >> highlightSelectedIn;
    in >> stretchLastSectionIn;
    in >> cascadingResizingIn;
    in >> stretchSectionsIn;
    in >> contentsSectionsIn;
    in >> defaultSectionSizeIn;
    in >> minimumSectionSizeIn;

    in >> align;

    in >> global;

    // Check parameter consistency
    // Global orientation out of bounds?
    if (global < 0 || global > QHeaderView::ResizeToContents)
        return false;

    // Alignment out of bounds?
    if (align < 0 || align > Qt::AlignVertical_Mask)
        return false;

    in >> sectionItemsIn;


    // In Qt4 we had a vector of spans where one span could hold information on more sections.
    // Now we have an itemvector where one items contains information about one section
    // For backward compatibility with Qt4 we do the following
    QList<SectionItem> newSectionItems;
    for (int u = 0; u < sectionItemsIn.size(); ++u) {
        int count = sectionItemsIn.at(u).tmpDataStreamSectionCount;
        if (count > 1)
            sectionItemsIn[u].size /= count;
        for (int n = 0; n < count; ++n)
            newSectionItems.append(sectionItemsIn[u]);
    }

    int sectionItemsLengthTotal = 0;
    for (const SectionItem &section : std::as_const(newSectionItems))
        sectionItemsLengthTotal += section.size;

    if (sectionItemsLengthTotal != lengthIn && newSectionItems.size() > 0)
        return false;

    // We don't want to do an actual change in normal mode.
    // (Hence we have already set up sections etc)
    headerMode = HeaderMode::FlexibleWithSectionMemoryUsage;

    orientation = static_cast<Qt::Orientation>(orient);
    sortIndicatorOrder = static_cast<Qt::SortOrder>(order);
    sortIndicatorSection = sortIndicatorSectionIn;
    sortIndicatorShown = sortIndicatorShownIn;
    visualIndices = visualIndicesIn;
    logicalIndices = logicalIndicesIn;
    hiddenSectionSize = hiddenSectionSizeIn;
    length = lengthIn;

    movableSections = movableSectionsIn;
    clickableSections = clickableSectionsIn;
    highlightSelected = highlightSelectedIn;
    stretchLastSection = stretchLastSectionIn;
    cascadingResizing = cascadingResizingIn;
    stretchSections = stretchSectionsIn;
    contentsSections = contentsSectionsIn;
    defaultSectionSize = defaultSectionSizeIn;
    minimumSectionSize = minimumSectionSizeIn;

    defaultAlignment = Qt::Alignment(align);
    globalResizeMode = static_cast<QHeaderView::ResizeMode>(global);

    sectionItems = newSectionItems;
    setHiddenSectionsFromBitVector(sectionHidden);
    recalcSectionStartPos();

    int tmpint;
    in >> tmpint;
    if (in.status() == QDataStream::Ok)  // we haven't read past end
        resizeContentsPrecision = tmpint;

    bool tmpbool;
    in >> tmpbool;
    if (in.status() == QDataStream::Ok) {  // we haven't read past end
        customDefaultSectionSize = tmpbool;
        if (!customDefaultSectionSize)
            updateDefaultSectionSizeFromStyle();
    }

    lastSectionSize = -1;
    int inLastSectionSize;
    in >> inLastSectionSize;
    if (in.status() == QDataStream::Ok)
        lastSectionSize = inLastSectionSize;

    lastSectionLogicalIdx = -1;
    if (stretchLastSection) {
        lastSectionLogicalIdx = q->logicalIndex(lastVisibleVisualIndex());
        doDelayedResizeSections();
    }

    int inSortIndicatorClearable;
    in >> inSortIndicatorClearable;
    if (in.status() == QDataStream::Ok)  // we haven't read past end
        sortIndicatorClearable = inSortIndicatorClearable;

    in >> countInNoSectionItemsMode;
    int iHeaderMode;

    in >> iHeaderMode;
    // On any failure (especially reading past end) we consider mode to be normal by default.
    if (in.status() != QDataStream::Ok) {
        iHeaderMode = static_cast<int>(HeaderMode::FlexibleWithSectionMemoryUsage);
    }

    const HeaderMode impMode = static_cast<HeaderMode>(iHeaderMode);
    if (impMode == HeaderMode::FlexibleWithSectionMemoryUsage || impMode == HeaderMode::InitialNoSectionMemoryUsage) {
        headerMode = impMode;
    }
    else {
        // Then it must be from a newer version with a new enum value and we simply
        // take the best match.
        if (countInNoSectionItemsMode > 0 && sectionItems.isEmpty()) {
            headerMode = HeaderMode::InitialNoSectionMemoryUsage;
        }
        else if (countInNoSectionItemsMode <= 0 && !sectionItems.isEmpty()) {
            headerMode = HeaderMode::FlexibleWithSectionMemoryUsage;
        }
        else {
            // We shouldn't end up with both sections and a section count (countInNoSectionItemsMode) > 0.
            headerMode = HeaderMode::FlexibleWithSectionMemoryUsage;
            return false;
        }
    }

    // Append items from model.
    const int currentCount = (orient == Qt::Horizontal ? model->columnCount(root) : model->rowCount(root));
    if (sectionItems.size() < currentCount) {

        if (noSectionMemoryUsage()) {
            countInNoSectionItemsMode = currentCount;
            length = defaultSectionSize * countInNoSectionItemsMode;
        } else {
             // we have sections not in the saved state, give them default settings
            if (!visualIndicesIn.isEmpty() && !logicalIndicesIn.isEmpty()) {
                for (int i = sectionItems.size(); i < currentCount; ++i) {
                    visualIndices.append(i);
                    logicalIndices.append(i);
                }
            }
            const int insertCount = currentCount - sectionItems.size();
            const int insertLength = defaultSectionSizeIn * insertCount;
            lengthIn += insertLength;
            SectionItem section(defaultSectionSizeIn, globalResizeMode);
            sectionItems.insert(sectionItems.size(), insertCount, section); // append
        }
    }
    return true;
}